

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O0

SSVectorBase<double> * __thiscall
soplex::SSVectorBase<double>::operator=(SSVectorBase<double> *this,SSVectorBase<double> *rhs)

{
  value_type vVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  const_reference pvVar5;
  reference pvVar6;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  undefined8 extraout_RDX_00;
  SSVectorBase<double> *in_RSI;
  SSVectorBase<double> *in_RDI;
  Real RVar8;
  double dVar9;
  int i_1;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  SSVectorBase<double> *in_stack_ffffffffffffffb0;
  IdxSet *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar10;
  int iVar11;
  uint local_14;
  
  if (in_RDI != in_RSI) {
    clear(in_stack_ffffffffffffffb0);
    std::shared_ptr<soplex::Tolerances>::operator=
              ((shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffffb0,
               (shared_ptr<soplex::Tolerances> *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    IdxSet::max(&in_RSI->super_IdxSet);
    setMax(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    dim((SSVectorBase<double> *)0x27f2f2);
    VectorBase<double>::reDim
              ((VectorBase<double> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
    bVar2 = isSetup(in_RSI);
    if (bVar2) {
      IdxSet::operator=((IdxSet *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
      local_14 = size((SSVectorBase<double> *)0x27f32f);
      uVar7 = extraout_RDX;
      while (local_14 = local_14 - 1, -1 < (int)local_14) {
        pcVar4 = index(in_RDI,(char *)(ulong)local_14,(int)uVar7);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(in_RSI->super_VectorBase<double>).val,(long)(int)pcVar4);
        vVar1 = *pvVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(in_RDI->super_VectorBase<double>).val,(long)(int)pcVar4);
        *pvVar6 = vVar1;
        uVar7 = extraout_RDX_00;
      }
    }
    else {
      (in_RDI->super_IdxSet).num = 0;
      iVar10 = 0;
      while (iVar11 = iVar10, iVar3 = dim((SSVectorBase<double> *)0x27f3c1), iVar10 < iVar3) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(in_RSI->super_VectorBase<double>).val,(long)iVar11);
        RVar8 = spxAbs<double>(*pvVar5);
        dVar9 = getEpsilon(in_stack_ffffffffffffffb0);
        if (dVar9 < RVar8) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&(in_RSI->super_VectorBase<double>).val,(long)iVar11);
          in_stack_ffffffffffffffb0 = (SSVectorBase<double> *)*pvVar5;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&(in_RDI->super_VectorBase<double>).val,(long)iVar11);
          *pvVar6 = (value_type)in_stack_ffffffffffffffb0;
          (in_RDI->super_IdxSet).idx[(in_RDI->super_IdxSet).num] = iVar11;
          (in_RDI->super_IdxSet).num = (in_RDI->super_IdxSet).num + 1;
        }
        iVar10 = iVar11 + 1;
      }
    }
    in_RDI->setupStatus = true;
  }
  return in_RDI;
}

Assistant:

SSVectorBase<R>& operator=(const SSVectorBase<R>& rhs)
   {
      assert(rhs.isConsistent());

      if(this != &rhs)
      {
         clear();
         _tolerances = rhs._tolerances;
         setMax(rhs.max());
         VectorBase<R>::reDim(rhs.dim());

         if(rhs.isSetup())
         {
            IdxSet::operator=(rhs);

            for(int i = size() - 1; i >= 0; --i)
            {
               int j = index(i);
               VectorBase<R>::val[j] = rhs.val[j];
            }
         }
         else
         {
            num = 0;

            for(int i = 0; i < rhs.dim(); ++i)
            {
               if(spxAbs(rhs.val[i]) > this->getEpsilon())
               {
                  VectorBase<R>::val[i] = rhs.val[i];
                  idx[num] = i;
                  num++;
               }
            }
         }

         setupStatus = true;
      }

      assert(isConsistent());

      return *this;
   }